

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int m_eq_1(char *z)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  cVar1 = *z;
  iVar2 = 0;
  if (cVar1 != '\0') {
    pcVar3 = z + 1;
    while( true ) {
      if ((long)cVar1 == 0x79) {
        iVar2 = isConsonant(pcVar3);
      }
      else {
        iVar2 = 1 - (char)(&DAT_001ded9f)[cVar1];
      }
      if (iVar2 == 0) break;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      if (cVar1 == '\0') {
        return 0;
      }
    }
    pcVar3 = pcVar3 + -1;
    do {
      pcVar4 = pcVar3;
      iVar2 = isConsonant(pcVar4);
      pcVar3 = pcVar4 + 1;
    } while (iVar2 != 0);
    cVar1 = *pcVar4;
    if (cVar1 == '\0') {
      return 0;
    }
    do {
      if ((long)cVar1 == 0x79) {
        iVar2 = isConsonant(pcVar3);
      }
      else {
        iVar2 = 1 - (char)(&DAT_001ded9f)[cVar1];
      }
      if (iVar2 == 0) {
        pcVar3 = pcVar3 + -1;
        do {
          pcVar4 = pcVar3;
          iVar2 = isConsonant(pcVar4);
          pcVar3 = pcVar4 + 1;
        } while (iVar2 != 0);
        return (uint)(*pcVar4 == '\0');
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int isVowel(const char *z){
  int j;
  char x = *z;
  if( x==0 ) return 0;
  assert( x>='a' && x<='z' );
  j = cType[x-'a'];
  if( j<2 ) return 1-j;
  return isConsonant(z + 1);
}